

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Signaler::Signaler(Signaler *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  SystemException *this_00;
  long lVar4;
  allocator local_51;
  string local_50;
  
  iVar2 = pipe((int *)this);
  if (iVar2 == 0) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
      iVar2 = *(int *)((long)(this->pipefd_)._M_elems + lVar4);
      uVar3 = fcntl(iVar2,3,0);
      uVar1 = uVar3 | 0x800;
      if (uVar3 == 0xffffffff) {
        uVar1 = 0x800;
      }
      fcntl(iVar2,4,(ulong)uVar1);
    }
    return;
  }
  this_00 = (SystemException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_50,"pipe",&local_51);
  SystemException::SystemException(this_00,&local_50,iVar2);
  __cxa_throw(this_00,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Signaler() {
            auto status = pipe(pipefd_.data());
            if (status) {
                throw SystemException("pipe", status);
            }
            for(auto fd : pipefd_) {
                int flags = 0;
                if (-1 == (flags = fcntl(fd, F_GETFL, 0)))
                    flags = 0;
                fcntl(fd, F_SETFL, flags | O_NONBLOCK);
            }
        }